

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenerators::SetupAutoGenerateTarget(cmQtAutoGenerators *this,cmTarget *target)

{
  cmMakefile *this_00;
  _Alloc_hider outfile;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  allocator local_36d;
  mode_t perm;
  string inputFile;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configIncludes;
  string outputFile;
  ScopePushPop varScope;
  string error;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configDefines;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configUicOptions;
  string autogenTargetName;
  ofstream infoFile;
  string targetDir;
  
  this_00 = target->Makefile;
  varScope.Makefile = this_00;
  cmMakefile::PushScope(this_00);
  getAutogenTargetName_abi_cxx11_(&autogenTargetName,target);
  std::__cxx11::string::string((string *)&infoFile,"_moc_target_name",(allocator *)&configDefines);
  cmOutputConverter::EscapeForCMake((string *)&configIncludes,&autogenTargetName);
  cmMakefile::AddDefinition(this_00,(string *)&infoFile,(char *)configIncludes._M_t._M_impl._0_8_);
  std::__cxx11::string::~string((string *)&configIncludes);
  std::__cxx11::string::~string((string *)&infoFile);
  std::__cxx11::string::string
            ((string *)&infoFile,"_origin_target_name",(allocator *)&configDefines);
  cmOutputConverter::EscapeForCMake((string *)&configIncludes,&target->Name);
  cmMakefile::AddDefinition(this_00,(string *)&infoFile,(char *)configIncludes._M_t._M_impl._0_8_);
  std::__cxx11::string::~string((string *)&configIncludes);
  std::__cxx11::string::~string((string *)&infoFile);
  getAutogenTargetDir_abi_cxx11_(&targetDir,target);
  std::__cxx11::string::string
            ((string *)&infoFile,"Qt5Core_VERSION_MAJOR",(allocator *)&configIncludes);
  pcVar2 = cmMakefile::GetDefinition(this_00,(string *)&infoFile);
  std::__cxx11::string::~string((string *)&infoFile);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&infoFile,"QT_VERSION_MAJOR",(allocator *)&configIncludes);
    pcVar2 = cmMakefile::GetDefinition(this_00,(string *)&infoFile);
    std::__cxx11::string::~string((string *)&infoFile);
  }
  std::__cxx11::string::string((string *)&infoFile,"QT_MAJOR_VERSION",(allocator *)&configDefines);
  std::__cxx11::string::string((string *)&configIncludes,"",(allocator *)&configUicOptions);
  pcVar3 = cmTarget::GetLinkInterfaceDependentStringProperty
                     (target,(string *)&infoFile,(string *)&configIncludes);
  std::__cxx11::string::~string((string *)&configIncludes);
  std::__cxx11::string::~string((string *)&infoFile);
  if (pcVar3 != (char *)0x0) {
    pcVar2 = pcVar3;
  }
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&infoFile,"_target_qt_version",(allocator *)&configIncludes);
    cmMakefile::AddDefinition(this_00,(string *)&infoFile,pcVar2);
    std::__cxx11::string::~string((string *)&infoFile);
  }
  configIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &configIncludes._M_t._M_impl.super__Rb_tree_header._M_header;
  configIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  configIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  configIncludes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  configDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &configDefines._M_t._M_impl.super__Rb_tree_header._M_header;
  configDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  configDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  configDefines._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header;
  configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  configUicOptions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  configIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       configIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  configDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       configDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&infoFile,"AUTOMOC",(allocator *)&error);
  bVar1 = cmTarget::GetPropertyAsBool(target,(string *)&infoFile);
  if (bVar1) {
LAB_002a5a31:
    std::__cxx11::string::~string((string *)&infoFile);
  }
  else {
    std::__cxx11::string::string((string *)&inputFile,"AUTOUIC",(allocator *)&perm);
    bVar1 = cmTarget::GetPropertyAsBool(target,&inputFile);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&inputFile);
      goto LAB_002a5a31;
    }
    std::__cxx11::string::string((string *)&outputFile,"AUTORCC",&local_36d);
    bVar1 = cmTarget::GetPropertyAsBool(target,&outputFile);
    std::__cxx11::string::~string((string *)&outputFile);
    std::__cxx11::string::~string((string *)&inputFile);
    std::__cxx11::string::~string((string *)&infoFile);
    if (!bVar1) goto LAB_002a5a49;
  }
  SetupSourceFiles(this,target);
LAB_002a5a49:
  std::__cxx11::string::string((string *)&infoFile,"_cpp_files",(allocator *)&outputFile);
  cmOutputConverter::EscapeForCMake(&inputFile,&this->Sources);
  cmMakefile::AddDefinition(this_00,(string *)&infoFile,inputFile._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&inputFile);
  std::__cxx11::string::~string((string *)&infoFile);
  std::__cxx11::string::string((string *)&infoFile,"AUTOMOC",(allocator *)&inputFile);
  bVar1 = cmTarget::GetPropertyAsBool(target,(string *)&infoFile);
  std::__cxx11::string::~string((string *)&infoFile);
  if (bVar1) {
    SetupAutoMocTarget(this,target,&autogenTargetName,&configIncludes,&configDefines);
  }
  std::__cxx11::string::string((string *)&infoFile,"AUTOUIC",(allocator *)&inputFile);
  bVar1 = cmTarget::GetPropertyAsBool(target,(string *)&infoFile);
  std::__cxx11::string::~string((string *)&infoFile);
  if (bVar1) {
    SetupAutoUicTarget(this,target,&configUicOptions);
  }
  std::__cxx11::string::string((string *)&infoFile,"AUTORCC",(allocator *)&inputFile);
  bVar1 = cmTarget::GetPropertyAsBool(target,(string *)&infoFile);
  std::__cxx11::string::~string((string *)&infoFile);
  if (bVar1) {
    SetupAutoRccTarget(this,target);
  }
  std::__cxx11::string::string((string *)&infoFile,"CMAKE_ROOT",(allocator *)&inputFile);
  pcVar2 = cmMakefile::GetSafeDefinition(this_00,(string *)&infoFile);
  std::__cxx11::string::~string((string *)&infoFile);
  std::__cxx11::string::string((string *)&inputFile,pcVar2,(allocator *)&infoFile);
  std::__cxx11::string::append((char *)&inputFile);
  std::__cxx11::string::string((string *)&outputFile,(string *)&targetDir);
  std::__cxx11::string::append((char *)&outputFile);
  std::__cxx11::string::string((string *)&infoFile,"_qt_rcc_inputs",(allocator *)&perm);
  std::operator+(&error,"_qt_rcc_inputs_",&target->Name);
  pcVar2 = cmMakefile::GetDefinition(this_00,&error);
  cmMakefile::AddDefinition(this_00,(string *)&infoFile,pcVar2);
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string((string *)&infoFile);
  outfile = outputFile._M_dataplus;
  cmNewLineStyle::cmNewLineStyle((cmNewLineStyle *)&infoFile);
  cmMakefile::ConfigureFile
            (this_00,inputFile._M_dataplus._M_p,outfile._M_p,false,true,false,
             (cmNewLineStyle *)&infoFile);
  perm = 0;
  cmsys::SystemTools::GetPermissions(&outputFile,&perm);
  if (-1 < (char)perm) {
    cmsys::SystemTools::SetPermissions(&outputFile,perm | 0x80);
  }
  if (((configDefines._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) ||
      (configIncludes._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) ||
     (configUicOptions._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    std::ofstream::ofstream(&infoFile,outputFile._M_dataplus._M_p,_S_app);
    if (((&infoFile.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)infoFile.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]]
        & 5) == 0) {
      if (configDefines._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        for (p_Var5 = configDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != &configDefines._M_t._M_impl.super__Rb_tree_header;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          poVar4 = std::operator<<(&infoFile.super_basic_ostream<char,_std::char_traits<char>_>,
                                   "set(AM_MOC_COMPILE_DEFINITIONS_");
          poVar4 = std::operator<<(poVar4,(string *)(p_Var5 + 1));
          poVar4 = std::operator<<(poVar4," ");
          poVar4 = std::operator<<(poVar4,(string *)(p_Var5 + 2));
          std::operator<<(poVar4,")\n");
        }
      }
      if (configIncludes._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        for (p_Var5 = configIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != &configIncludes._M_t._M_impl.super__Rb_tree_header;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          poVar4 = std::operator<<(&infoFile.super_basic_ostream<char,_std::char_traits<char>_>,
                                   "set(AM_MOC_INCLUDES_");
          poVar4 = std::operator<<(poVar4,(string *)(p_Var5 + 1));
          poVar4 = std::operator<<(poVar4," ");
          poVar4 = std::operator<<(poVar4,(string *)(p_Var5 + 2));
          std::operator<<(poVar4,")\n");
        }
      }
      if (configUicOptions._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        for (p_Var5 = configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != &configUicOptions._M_t._M_impl.super__Rb_tree_header;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          poVar4 = std::operator<<(&infoFile.super_basic_ostream<char,_std::char_traits<char>_>,
                                   "set(AM_UIC_TARGET_OPTIONS_");
          poVar4 = std::operator<<(poVar4,(string *)(p_Var5 + 1));
          poVar4 = std::operator<<(poVar4," ");
          poVar4 = std::operator<<(poVar4,(string *)(p_Var5 + 2));
          std::operator<<(poVar4,")\n");
        }
      }
    }
    else {
      std::__cxx11::string::string
                ((string *)&error,"Internal CMake error when trying to open file: ",&local_36d);
      std::__cxx11::string::append((char *)&error);
      std::__cxx11::string::append((char *)&error);
      cmSystemTools::Error(error._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)&error);
    }
    std::ofstream::~ofstream(&infoFile);
  }
  std::__cxx11::string::~string((string *)&outputFile);
  std::__cxx11::string::~string((string *)&inputFile);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&configUicOptions._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&configDefines._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&configIncludes._M_t);
  std::__cxx11::string::~string((string *)&targetDir);
  std::__cxx11::string::~string((string *)&autogenTargetName);
  cmMakefile::ScopePushPop::~ScopePushPop(&varScope);
  return;
}

Assistant:

void cmQtAutoGenerators::SetupAutoGenerateTarget(cmTarget const* target)
{
  cmMakefile* makefile = target->GetMakefile();

  // forget the variables added here afterwards again:
  cmMakefile::ScopePushPop varScope(makefile);
  static_cast<void>(varScope);

  // create a custom target for running generators at buildtime:
  std::string autogenTargetName = getAutogenTargetName(target);

  makefile->AddDefinition("_moc_target_name",
          cmOutputConverter::EscapeForCMake(autogenTargetName).c_str());
  makefile->AddDefinition("_origin_target_name",
          cmOutputConverter::EscapeForCMake(target->GetName()).c_str());

  std::string targetDir = getAutogenTargetDir(target);

  const char *qtVersion = makefile->GetDefinition("Qt5Core_VERSION_MAJOR");
  if (!qtVersion)
    {
    qtVersion = makefile->GetDefinition("QT_VERSION_MAJOR");
    }
  if (const char *targetQtVersion =
      target->GetLinkInterfaceDependentStringProperty("QT_MAJOR_VERSION", ""))
    {
    qtVersion = targetQtVersion;
    }
  if (qtVersion)
    {
    makefile->AddDefinition("_target_qt_version", qtVersion);
    }

  std::map<std::string, std::string> configIncludes;
  std::map<std::string, std::string> configDefines;
  std::map<std::string, std::string> configUicOptions;

  if (target->GetPropertyAsBool("AUTOMOC")
      || target->GetPropertyAsBool("AUTOUIC")
      || target->GetPropertyAsBool("AUTORCC"))
    {
    this->SetupSourceFiles(target);
    }
  makefile->AddDefinition("_cpp_files",
          cmOutputConverter::EscapeForCMake(this->Sources).c_str());
  if (target->GetPropertyAsBool("AUTOMOC"))
    {
    this->SetupAutoMocTarget(target, autogenTargetName,
                             configIncludes, configDefines);
    }
  if (target->GetPropertyAsBool("AUTOUIC"))
    {
    this->SetupAutoUicTarget(target, configUicOptions);
    }
  if (target->GetPropertyAsBool("AUTORCC"))
    {
    this->SetupAutoRccTarget(target);
    }

  const char* cmakeRoot = makefile->GetSafeDefinition("CMAKE_ROOT");
  std::string inputFile = cmakeRoot;
  inputFile += "/Modules/AutogenInfo.cmake.in";
  std::string outputFile = targetDir;
  outputFile += "/AutogenInfo.cmake";
  makefile->AddDefinition("_qt_rcc_inputs",
              makefile->GetDefinition("_qt_rcc_inputs_" + target->GetName()));
  makefile->ConfigureFile(inputFile.c_str(), outputFile.c_str(),
                          false, true, false);

  // Ensure we have write permission in case .in was read-only.
  mode_t perm = 0;
#if defined(_WIN32) && !defined(__CYGWIN__)
  mode_t mode_write = S_IWRITE;
#else
  mode_t mode_write = S_IWUSR;
#endif
  cmSystemTools::GetPermissions(outputFile, perm);
  if (!(perm & mode_write))
    {
    cmSystemTools::SetPermissions(outputFile, perm | mode_write);
    }
  if (!configDefines.empty()
      || !configIncludes.empty()
      || !configUicOptions.empty())
    {
    cmsys::ofstream infoFile(outputFile.c_str(), std::ios::app);
    if ( !infoFile )
      {
      std::string error = "Internal CMake error when trying to open file: ";
      error += outputFile.c_str();
      error += " for writing.";
      cmSystemTools::Error(error.c_str());
      return;
      }
    if (!configDefines.empty())
      {
      for (std::map<std::string, std::string>::iterator
            it = configDefines.begin(), end = configDefines.end();
            it != end; ++it)
        {
        infoFile << "set(AM_MOC_COMPILE_DEFINITIONS_" << it->first <<
          " " << it->second << ")\n";
        }
      }
    if (!configIncludes.empty())
      {
      for (std::map<std::string, std::string>::iterator
            it = configIncludes.begin(), end = configIncludes.end();
            it != end; ++it)
        {
        infoFile << "set(AM_MOC_INCLUDES_" << it->first <<
          " " << it->second << ")\n";
        }
      }
    if (!configUicOptions.empty())
      {
      for (std::map<std::string, std::string>::iterator
            it = configUicOptions.begin(), end = configUicOptions.end();
            it != end; ++it)
        {
        infoFile << "set(AM_UIC_TARGET_OPTIONS_" << it->first <<
          " " << it->second << ")\n";
        }
      }
    }
}